

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateConditional(ExpressionEvalContext *ctx,ExprConditional *expression)

{
  bool bVar1;
  StackFrame **ppSVar2;
  ExprBase *pEVar3;
  SynBase *local_50;
  ExprBase *value;
  longlong result;
  ExprBase *condition;
  ExprConditional *expression_local;
  ExpressionEvalContext *ctx_local;
  
  condition = &expression->super_ExprBase;
  expression_local = (ExprConditional *)ctx;
  bVar1 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::empty(&ctx->stackFrames);
  if ((!bVar1) &&
     (ppSVar2 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back
                          ((SmallArray<ExpressionEvalContext::StackFrame_*,_32U> *)
                           &(expression_local->super_ExprBase).next), (*ppSVar2)->targetYield != 0))
  {
    pEVar3 = &ExpressionContext::get<ExprVoid>
                        ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase)->
              super_ExprBase;
    ExprVoid::ExprVoid((ExprVoid *)pEVar3,condition->source,
                       (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1137]);
    return pEVar3;
  }
  bVar1 = AddInstruction((ExpressionEvalContext *)expression_local);
  if (bVar1) {
    result = (longlong)
             Evaluate((ExpressionEvalContext *)expression_local,
                      (ExprBase *)condition[1]._vptr_ExprBase);
    if ((ExprBase *)result == (ExprBase *)0x0) {
      ctx_local = (ExpressionEvalContext *)0x0;
    }
    else {
      bVar1 = TryTakeLong((ExprBase *)result,(longlong *)&value);
      if (bVar1) {
        if (value == (ExprBase *)0x0) {
          local_50 = condition[1].source;
        }
        else {
          local_50 = *(SynBase **)&condition[1].typeID;
        }
        pEVar3 = Evaluate((ExpressionEvalContext *)expression_local,(ExprBase *)local_50);
        if (pEVar3 == (ExprBase *)0x0) {
          ctx_local = (ExpressionEvalContext *)0x0;
        }
        else {
          ctx_local = (ExpressionEvalContext *)CheckType(condition,pEVar3);
        }
      }
      else {
        ctx_local = (ExpressionEvalContext *)
                    Report((ExpressionEvalContext *)expression_local,
                           "ERROR: failed to evaluate ternary operator condition");
      }
    }
  }
  else {
    ctx_local = (ExpressionEvalContext *)0x0;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* EvaluateConditional(ExpressionEvalContext &ctx, ExprConditional *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *condition = Evaluate(ctx, expression->condition);

	if(!condition)
		return NULL;

	long long result;
	if(!TryTakeLong(condition, result))
		return Report(ctx, "ERROR: failed to evaluate ternary operator condition");

	ExprBase *value = Evaluate(ctx, result ? expression->trueBlock : expression->falseBlock);

	if(!value)
		return NULL;

	return CheckType(expression, value);
}